

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueConverter.cpp
# Opt level: O0

void helics::detail::convertFromBinary
               (byte *data,vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *val
               )

{
  bool bVar1;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *this;
  complex<double> *__dest;
  byte *in_RDI;
  complex<double> *value;
  iterator __end3;
  iterator __begin3;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *__range3;
  size_t size;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *in_stack_ffffffffffffffb8;
  reference in_stack_ffffffffffffffc0;
  __normal_iterator<std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
  local_30;
  size_type in_stack_ffffffffffffffd8;
  
  this = (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)getDataSize(in_RDI)
  ;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::resize
            (this,in_stack_ffffffffffffffd8);
  if (this != (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)0x0) {
    __dest = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::data
                       ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                        0x44e36e);
    memcpy(__dest,in_RDI + 8,(long)this << 4);
  }
  if ((*in_RDI & 1) != 0) {
    local_30._M_current =
         (complex<double> *)
         std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::begin
                   (in_stack_ffffffffffffffb8);
    std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::end
              (in_stack_ffffffffffffffb8);
    while (bVar1 = __gnu_cxx::
                   operator==<std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
                             ((__normal_iterator<std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
                               *)in_stack_ffffffffffffffc0,
                              (__normal_iterator<std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
                               *)in_stack_ffffffffffffffb8), ((bVar1 ^ 0xffU) & 1) != 0) {
      in_stack_ffffffffffffffc0 =
           __gnu_cxx::
           __normal_iterator<std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
           ::operator*(&local_30);
      checks::swapBytes<8ul>((byte *)in_stack_ffffffffffffffc0);
      checks::swapBytes<8ul>((byte *)in_stack_ffffffffffffffc0);
      __gnu_cxx::
      __normal_iterator<std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
      ::operator++(&local_30);
    }
  }
  return;
}

Assistant:

void convertFromBinary(const std::byte* data, std::vector<std::complex<double>>& val)
{
    const std::size_t size = getDataSize(data);
    val.resize(size);
    if (size > 0) {
        std::memcpy(reinterpret_cast<double*>(val.data()),
                    data + 8,
                    size * sizeof(std::complex<double>));
    }
    if ((data[0] & endianMask) != littleEndianCode) {
        for (auto& value : val) {
            // making use of array oriented access for complex numbers
            // See https://en.cppreference.com/w/cpp/numeric/complex
            checks::swapBytes<8>(reinterpret_cast<std::byte*>(&value));
            checks::swapBytes<8>(reinterpret_cast<std::byte*>(&value) + 8);
        }
    }
}